

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O0

string * dynamicgraph::command::docCommandVerbose(string *__return_storage_ptr__,string *doc)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *doc_local;
  
  local_18 = doc;
  doc_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"\n",&local_59);
  std::operator+(&local_38,&local_58,local_18);
  std::operator+(__return_storage_ptr__,&local_38,"\n\nNo input.\n Return a string.\n\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

inline std::string docCommandVerbose(const std::string &doc) {
  return std::string("\n") + doc + "\n\nNo input.\n Return a string.\n\n";
}